

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::SocketRecvFailed::SocketRecvFailed(SocketRecvFailed *this,ssize_t size)

{
  bool bVar1;
  allocator<char> local_4d [19];
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  ssize_t local_18;
  ssize_t size_local;
  SocketRecvFailed *this_local;
  
  local_3a = 0;
  bVar1 = false;
  local_18 = size;
  size_local = (ssize_t)this;
  if (size == 0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Connection reset by peer.",&local_39);
  }
  else {
    bVar1 = -1 < size;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Success.",local_4d);
    }
    else {
      SocketException::errorToWhat_abi_cxx11_();
    }
  }
  SocketException::SocketException(&this->super_SocketException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::allocator<char>::~allocator(local_4d);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  *(undefined ***)&(this->super_SocketException).super_Exception = &PTR__SocketRecvFailed_0032fcb8;
  return;
}

Assistant:

SocketRecvFailed(ssize_t size)
      : SocketException(
            size == 0  ? "Connection reset by peer."
            : size < 0 ? errorToWhat()
                       : "Success.") {}